

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathway.c
# Opt level: O0

pathway_directions_t parse_pathway_directions(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = strcmp(value,"0");
  if (iVar1 == 0) {
    value_local._4_4_ = PD_UNIDIRECTIONAL;
  }
  else {
    iVar1 = strcmp(value,"1");
    if (iVar1 == 0) {
      value_local._4_4_ = PD_BIDIRECTIONAL;
    }
    else {
      value_local._4_4_ = PD_NOT_SET;
    }
  }
  return value_local._4_4_;
}

Assistant:

pathway_directions_t parse_pathway_directions(const char *value) {
    if (strcmp(value, "0") == 0)
        return PD_UNIDIRECTIONAL;
    else if (strcmp(value, "1") == 0)
        return PD_BIDIRECTIONAL;
    else
        return PD_NOT_SET;
}